

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableStruct.cpp
# Opt level: O0

string * __thiscall
adios2::core::StructDefinition::Name_abi_cxx11_(StructDefinition *this,size_t index)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong in_RDX;
  vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
  *in_RSI;
  string *in_RDI;
  allocator local_c1;
  string local_c0 [4];
  int in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  ulong local_18;
  
  local_18 = in_RDX;
  sVar1 = std::
          vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
          ::size(in_RSI);
  if (sVar1 <= in_RDX) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"core",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"VariableStruct::StructDefinition",&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"Name",(allocator *)&stack0xffffffffffffff67);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"invalid index",&local_c1);
    helper::Throw<std::invalid_argument>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  pvVar2 = std::
           vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
           ::operator[](in_RSI,local_18);
  std::__cxx11::string::string((string *)in_RDI,(string *)pvVar2);
  return in_RDI;
}

Assistant:

std::string StructDefinition::Name(const size_t index) const
{
    if (index >= m_Definition.size())
    {
        helper::Throw<std::invalid_argument>("core", "VariableStruct::StructDefinition", "Name",
                                             "invalid index");
    }
    return m_Definition[index].Name;
}